

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O1

void Abc_NtkInsertMfs(Abc_Ntk_t *pNtk,Sfm_Ntk_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void *pvVar4;
  Abc_Obj_t *pAVar5;
  int iVar6;
  void *__s;
  Vec_Int_t *vCover;
  int *piVar7;
  Vec_Ptr_t *pVVar8;
  Vec_Int_t *pVVar9;
  word *pTruth;
  char *pSop;
  long lVar10;
  long lVar11;
  
  pVVar8 = pNtk->vObjs;
  iVar1 = pVVar8->nSize;
  iVar6 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  if (iVar6 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar6 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)iVar1 * 4);
  }
  pVVar2 = pNtk->vCis;
  if (0 < pVVar2->nSize) {
    ppvVar3 = pVVar2->pArray;
    lVar10 = 0;
    do {
      iVar6 = *(int *)((long)ppvVar3[lVar10] + 0x40);
      if (((long)iVar6 < 0) || (iVar1 <= iVar6)) goto LAB_002d3b9a;
      *(undefined4 *)((long)__s + (long)iVar6 * 4) = *(undefined4 *)((long)ppvVar3[lVar10] + 0x10);
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar2->nSize);
  }
  if (0 < pVVar8->nSize) {
    ppvVar3 = pVVar8->pArray;
    lVar10 = 0;
    do {
      pvVar4 = ppvVar3[lVar10];
      if ((pvVar4 != (void *)0x0) && ((*(uint *)((long)pvVar4 + 0x14) & 0xf) == 7)) {
        iVar6 = *(int *)((long)pvVar4 + 0x40);
        if (0 < (long)iVar6) {
          if (iVar1 <= iVar6) {
LAB_002d3b9a:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(undefined4 *)((long)__s + (long)iVar6 * 4) = *(undefined4 *)((long)pvVar4 + 0x10);
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      pAVar5 = (Abc_Obj_t *)pVVar8->pArray[lVar10];
      if ((pAVar5 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) {
        iVar6 = Sfm_NodeReadFixed(p,(pAVar5->field_6).iTemp);
        if (iVar6 == 0) {
          Abc_ObjRemoveFanins(pAVar5);
        }
      }
      lVar10 = lVar10 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar10 < pVVar8->nSize);
  }
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 0x10000;
  vCover->nSize = 0;
  piVar7 = (int *)malloc(0x40000);
  vCover->pArray = piVar7;
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      pAVar5 = (Abc_Obj_t *)pVVar8->pArray[lVar10];
      if (((pAVar5 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) &&
         ((pAVar5->field_6).iTemp != 0)) {
        iVar6 = Sfm_NodeReadFixed(p,(pAVar5->field_6).iTemp);
        if (iVar6 == 0) {
          iVar6 = Sfm_NodeReadUsed(p,(pAVar5->field_6).iTemp);
          if (iVar6 == 0) {
            Abc_NtkDeleteObj(pAVar5);
          }
          else {
            pVVar9 = Sfm_NodeReadFanins(p,(pAVar5->field_6).iTemp);
            if (0 < pVVar9->nSize) {
              lVar11 = 0;
              do {
                iVar6 = pVVar9->pArray[lVar11];
                if (((long)iVar6 < 0) || (iVar1 <= iVar6)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                iVar6 = *(int *)((long)__s + (long)iVar6 * 4);
                if (((long)iVar6 < 0) || (pNtk->vObjs->nSize <= iVar6)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                Abc_ObjAddFanin(pAVar5,(Abc_Obj_t *)pNtk->vObjs->pArray[iVar6]);
                lVar11 = lVar11 + 1;
              } while (lVar11 < pVVar9->nSize);
            }
            pTruth = Sfm_NodeReadTruth(p,(pAVar5->field_6).iTemp);
            pSop = Abc_SopCreateFromTruthIsop
                             ((Mem_Flex_t *)pNtk->pManFunc,pVVar9->nSize,pTruth,vCover);
            (pAVar5->field_5).pData = pSop;
            iVar6 = Abc_SopGetVarNum(pSop);
            if (iVar6 != pVVar9->nSize) {
              __assert_fail("Abc_SopGetVarNum((char *)pNode->pData) == Vec_IntSize(vArray)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMfs.c"
                            ,0xdd,"void Abc_NtkInsertMfs(Abc_Ntk_t *, Sfm_Ntk_t *)");
            }
          }
        }
      }
      lVar10 = lVar10 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar10 < pVVar8->nSize);
  }
  if (vCover->pArray != (int *)0x0) {
    free(vCover->pArray);
    vCover->pArray = (int *)0x0;
  }
  free(vCover);
  if (__s != (void *)0x0) {
    free(__s);
    return;
  }
  return;
}

Assistant:

void Abc_NtkInsertMfs( Abc_Ntk_t * pNtk, Sfm_Ntk_t * p )
{
    Vec_Int_t * vCover, * vMap, * vArray;
    Abc_Obj_t * pNode;
    word * pTruth;
    int i, k, Fanin;
    // map new IDs into old nodes
    vMap = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachCi( pNtk, pNode, i )
        Vec_IntWriteEntry( vMap, pNode->iTemp, Abc_ObjId(pNode) );
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( pNode->iTemp > 0 )
            Vec_IntWriteEntry( vMap, pNode->iTemp, Abc_ObjId(pNode) );
    // remove old fanins
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( !Sfm_NodeReadFixed(p, pNode->iTemp) )
            Abc_ObjRemoveFanins( pNode );
    // create new fanins
    vCover = Vec_IntAlloc( 1 << 16 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( pNode->iTemp == 0 || Sfm_NodeReadFixed(p, pNode->iTemp) )
            continue;
        if ( !Sfm_NodeReadUsed(p, pNode->iTemp) )
        {
            Abc_NtkDeleteObj( pNode );
            continue;
        }
        // update fanins
        vArray = Sfm_NodeReadFanins( p, pNode->iTemp );
        Vec_IntForEachEntry( vArray, Fanin, k )
            Abc_ObjAddFanin( pNode, Abc_NtkObj(pNtk, Vec_IntEntry(vMap, Fanin)) );
        pTruth = Sfm_NodeReadTruth( p, pNode->iTemp );
        pNode->pData = Abc_SopCreateFromTruthIsop( (Mem_Flex_t *)pNtk->pManFunc, Vec_IntSize(vArray), pTruth, vCover );
        assert( Abc_SopGetVarNum((char *)pNode->pData) == Vec_IntSize(vArray) );
    }
    Vec_IntFree( vCover );
    Vec_IntFree( vMap );
}